

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O1

void writenumber(uint i,FILE *fp)

{
  byte bVar1;
  
  fputc(0x32,(FILE *)fp);
  parity = parity ^ 0x32;
  fputc(0x34,(FILE *)fp);
  parity = parity ^ 0x34;
  fputc(0x30,(FILE *)fp);
  parity = parity ^ 0x30;
  fputc(0x36,(FILE *)fp);
  parity = parity ^ 0x36;
  bVar1 = (char)(i - 24000) + (char)((i - 24000) / 10) * -10 | 0x30;
  fputc((uint)bVar1,(FILE *)fp);
  parity = parity ^ bVar1;
  return;
}

Assistant:

static void writenumber(unsigned int i, FILE *fp) {
	int c;
	c=i/10000;
	i-=c*10000;
	writebyte(c+48, fp);
	c=i/1000;
	i-=c*1000;
	writebyte(c+48, fp);
	c=i/100;
	i-=c*100;
	writebyte(c+48, fp);
	c=i/10;
	writebyte(c+48, fp);
	i%=10;
	writebyte(i+48, fp);
}